

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

void __thiscall
mapbox::detail::Earcut<long>::operator()
          (Earcut<long> *this,
          vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
          *points)

{
  double dVar1;
  Node *pNVar2;
  size_t sVar3;
  bool bVar4;
  Node *pNVar5;
  const_reference pvVar6;
  size_type sVar7;
  double *pdVar8;
  double local_88;
  double local_60;
  double local_58;
  Node *local_50;
  Node *p;
  Node *outerNode;
  size_t i;
  size_t len;
  double dStack_28;
  int threshold;
  double y;
  double x;
  vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
  *points_local;
  Earcut<long> *this_local;
  
  x = (double)points;
  points_local = (vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                  *)this;
  std::vector<long,_std::allocator<long>_>::clear(&this->indices);
  this->vertices = 0;
  bVar4 = std::
          vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
          ::empty((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                   *)x);
  if (!bVar4) {
    len._4_4_ = 0x50;
    i = 0;
    outerNode = (Node *)0x0;
    while( true ) {
      pNVar2 = outerNode;
      bVar4 = false;
      if (-1 < len._4_4_) {
        pNVar5 = (Node *)std::
                         vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                         ::size((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                                 *)x);
        bVar4 = pNVar2 < pNVar5;
      }
      if (!bVar4) break;
      pvVar6 = std::
               vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
               ::operator[]((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                             *)x,(size_type)outerNode);
      sVar7 = std::
              vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ::size(pvVar6);
      len._4_4_ = len._4_4_ - (int)sVar7;
      pvVar6 = std::
               vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
               ::operator[]((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                             *)x,(size_type)outerNode);
      sVar7 = std::
              vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
              ::size(pvVar6);
      i = sVar7 + i;
      outerNode = (Node *)((long)&outerNode->i + 1);
    }
    ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
    ::reset(&this->nodes,i * 3 >> 1);
    sVar3 = i;
    pvVar6 = std::
             vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
             ::operator[]((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                           *)x,0);
    sVar7 = std::
            vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
            ::size(pvVar6);
    std::vector<long,_std::allocator<long>_>::reserve(&this->indices,sVar3 + sVar7);
    pvVar6 = std::
             vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
             ::operator[]((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                           *)x,0);
    p = linkedList<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>
                  (this,pvVar6,true);
    if (p != (Node *)0x0) {
      sVar7 = std::
              vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
              ::size((vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                      *)x);
      if (1 < sVar7) {
        p = eliminateHoles<std::vector<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>,std::allocator<std::vector<Eigen::Matrix<double,1,2,1,1,2>,std::allocator<Eigen::Matrix<double,1,2,1,1,2>>>>>>
                      (this,(vector<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>,_std::allocator<std::vector<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_std::allocator<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>_>_>
                             *)x,p);
      }
      this->hashing = len._4_4_ < 0;
      if ((this->hashing & 1U) != 0) {
        local_50 = p->next;
        dVar1 = p->x;
        this->maxX = dVar1;
        this->minX = dVar1;
        dVar1 = p->y;
        this->maxY = dVar1;
        this->minY = dVar1;
        do {
          y = local_50->x;
          dStack_28 = local_50->y;
          pdVar8 = std::min<double>(&this->minX,&y);
          this->minX = *pdVar8;
          pdVar8 = std::min<double>(&this->minY,&stack0xffffffffffffffd8);
          this->minY = *pdVar8;
          pdVar8 = std::max<double>(&this->maxX,&y);
          this->maxX = *pdVar8;
          pdVar8 = std::max<double>(&this->maxY,&stack0xffffffffffffffd8);
          this->maxY = *pdVar8;
          local_50 = local_50->next;
        } while (local_50 != p);
        local_58 = this->maxX - this->minX;
        local_60 = this->maxY - this->minY;
        pdVar8 = std::max<double>(&local_58,&local_60);
        this->inv_size = *pdVar8;
        if ((this->inv_size != 0.0) || (NAN(this->inv_size))) {
          local_88 = 1.0 / this->inv_size;
        }
        else {
          local_88 = 0.0;
        }
        this->inv_size = local_88;
      }
      earcutLinked(this,p,0);
      ObjectPool<mapbox::detail::Earcut<long>::Node,_std::allocator<mapbox::detail::Earcut<long>::Node>_>
      ::clear(&this->nodes);
    }
  }
  return;
}

Assistant:

void Earcut<N>::operator()(const Polygon& points) {
    // reset
    indices.clear();
    vertices = 0;

    if (points.empty()) return;

    double x;
    double y;
    int threshold = 80;
    std::size_t len = 0;

    for (size_t i = 0; threshold >= 0 && i < points.size(); i++) {
        threshold -= static_cast<int>(points[i].size());
        len += points[i].size();
    }

    //estimate size of nodes and indices
    nodes.reset(len * 3 / 2);
    indices.reserve(len + points[0].size());

    Node* outerNode = linkedList(points[0], true);
    if (!outerNode) return;

    if (points.size() > 1) outerNode = eliminateHoles(points, outerNode);

    // if the shape is not too simple, we'll use z-order curve hash later; calculate polygon bbox
    hashing = threshold < 0;
    if (hashing) {
        Node* p = outerNode->next;
        minX = maxX = outerNode->x;
        minY = maxY = outerNode->y;
        do {
            x = p->x;
            y = p->y;
            minX = std::min<double>(minX, x);
            minY = std::min<double>(minY, y);
            maxX = std::max<double>(maxX, x);
            maxY = std::max<double>(maxY, y);
            p = p->next;
        } while (p != outerNode);

        // minX, minY and size are later used to transform coords into integers for z-order calculation
        inv_size = std::max<double>(maxX - minX, maxY - minY);
        inv_size = inv_size != .0 ? (1. / inv_size) : .0;
    }

    earcutLinked(outerNode);

    nodes.clear();
}